

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::task_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::task_entry,_std::allocator<setup::task_entry>_> *result,enum_type entry_type
          )

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  task_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_148;
  task_entry local_140;
  
  local_148._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::task_entry,_std::allocator<setup::task_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_148,entry_type)
  ;
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_140.name._M_dataplus._M_p = (pointer)&local_140.name.field_2;
      local_140.name._M_string_length = 0;
      local_140.name.field_2._M_local_buf[0] = '\0';
      local_140.description._M_dataplus._M_p = (pointer)&local_140.description.field_2;
      local_140.description._M_string_length = 0;
      local_140.description.field_2._M_local_buf[0] = '\0';
      local_140.group_description._M_dataplus._M_p = (pointer)&local_140.group_description.field_2;
      local_140.group_description._M_string_length = 0;
      local_140.group_description.field_2._M_local_buf[0] = '\0';
      local_140.components._M_dataplus._M_p = (pointer)&local_140.components.field_2;
      local_140.components._M_string_length = 0;
      local_140.components.field_2._M_local_buf[0] = '\0';
      local_140.languages._M_dataplus._M_p = (pointer)&local_140.languages.field_2;
      local_140.languages._M_string_length = 0;
      local_140.languages.field_2._M_local_buf[0] = '\0';
      local_140.check._M_string_length = 0;
      local_140.check.field_2._M_local_buf[0] = '\0';
      local_140.options._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
      local_140.check._M_dataplus._M_p = (pointer)&local_140.check.field_2;
      task_entry::load(&local_140,is,this);
      item::~item((item *)&local_140);
    }
  }
  else {
    std::vector<setup::task_entry,_std::allocator<setup::task_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      task_entry::load((task_entry *)
                       ((long)&(((result->
                                 super__Vector_base<setup::task_entry,_std::allocator<setup::task_entry>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                       + lVar2),is,this);
      lVar2 = lVar2 + 0x110;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}